

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O1

bool ImPlot::DragLineX(char *id,double *value,bool show_label,ImVec4 *col,float thickness)

{
  float fVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  ImPlotPlot *pIVar5;
  ImGuiWindow *pIVar6;
  ImPlotContext *pIVar7;
  bool bVar8;
  ImU32 col_00;
  ImDrawList *this;
  ulong uVar9;
  float thickness_00;
  ImVec2 IVar10;
  double dVar11;
  undefined8 extraout_XMM0_Qb;
  float fVar12;
  float fVar13;
  double dVar14;
  ImPlotPoint IVar15;
  ImVec2 local_b0;
  ImVec2 local_a8;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  char *local_80;
  ImVec4 color;
  char buff [32];
  ImVec2 local_38;
  
  pIVar7 = GImPlot;
  pIVar5 = GImPlot->CurrentPlot;
  if (pIVar5 == (ImPlotPlot *)0x0) {
    __assert_fail("(gp.CurrentPlot != __null) && \"DragLineX() needs to be called between BeginPlot() and EndPlot()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xb17,
                  "bool ImPlot::DragLineX(const char *, double *, bool, const ImVec4 &, float)");
  }
  local_a8.x = thickness;
  fVar12 = 5.0;
  if (5.0 <= thickness) {
    fVar12 = thickness;
  }
  fVar1 = (pIVar5->PlotRect).Min.y;
  fVar2 = (pIVar5->PlotRect).Max.y;
  IVar10 = PlotToPixels(*value,0.0,-1);
  local_98 = (float)(int)(IVar10.x + 0.5);
  fStack_94 = (float)(int)IVar10.y;
  fStack_90 = (float)(int)(float)extraout_XMM0_Qb;
  fStack_8c = (float)(int)(float)((ulong)extraout_XMM0_Qb >> 0x20);
  fVar13 = fVar12 * 0.5;
  if (((pIVar7->CurrentPlot->PlotRect).Min.x - fVar13 <= local_98) &&
     (local_98 <= (pIVar7->CurrentPlot->PlotRect).Max.x + fVar13)) {
    fVar3 = (pIVar7->Style).MajorTickLen.x;
    local_80 = id;
    if ((col->w == -1.0) && (!NAN(col->w))) {
      col = ImGui::GetStyleColorVec4(0);
    }
    color.x = col->x;
    color.y = col->y;
    color.z = col->z;
    color.w = col->w;
    col_00 = ImGui::ColorConvertFloat4ToU32(&color);
    this = ImGui::GetWindowDrawList();
    PushPlotClipRect(0.0);
    buff._0_4_ = local_98;
    local_b0.x = local_98;
    local_b0.y = fVar2;
    buff._4_4_ = fVar1;
    ImDrawList::AddLine(this,(ImVec2 *)buff,&local_b0,col_00,local_a8.x);
    buff._0_4_ = local_98;
    local_b0.y = fVar1 + fVar3;
    local_b0.x = local_98;
    thickness_00 = local_a8.x * 3.0;
    local_a8.x = thickness_00;
    buff._4_4_ = fVar1;
    ImDrawList::AddLine(this,(ImVec2 *)buff,&local_b0,col_00,thickness_00);
    buff._0_4_ = local_98;
    local_b0.y = fVar2 - fVar3;
    local_b0.x = local_98;
    buff._4_4_ = fVar2;
    ImDrawList::AddLine(this,(ImVec2 *)buff,&local_b0,col_00,local_a8.x);
    ImGui::PopClipRect();
    if ((pIVar7->CurrentPlot->Selecting == false) && (pIVar7->CurrentPlot->Querying == false)) {
      local_a8 = ImGui::GetCursorScreenPos();
      pIVar6 = GImGui->CurrentWindow;
      pIVar6->WriteAccessed = true;
      (pIVar6->DC).CursorPos.x = local_98 - fVar13;
      (pIVar6->DC).CursorPos.y = fVar1;
      buff._4_4_ = fVar2 - fVar1;
      buff._0_4_ = fVar12;
      ImGui::InvisibleButton(local_80,(ImVec2 *)buff,0);
      pIVar6 = GImGui->CurrentWindow;
      pIVar6->WriteAccessed = true;
      (pIVar6->DC).CursorPos = local_a8;
      bVar8 = ImGui::IsItemHovered(0);
      if ((bVar8) || (bVar8 = ImGui::IsItemActive(), bVar8)) {
        pIVar7->CurrentPlot->PlotHovered = false;
        ImGui::SetMouseCursor(4);
        if (show_label) {
          LabelAxisValue(&pIVar7->CurrentPlot->XAxis,&pIVar7->XTicks,*value,buff,0x20);
          local_b0.x = local_98;
          local_38.x = 0.0;
          local_38.y = 0.0;
          local_b0.y = fVar2;
          ImPlotAnnotationCollection::Append
                    (&pIVar7->Annotations,&local_b0,&local_38,col_00,
                     -(uint)(color.z * 0.114 + color.x * 0.299 + color.y * 0.587 <= 0.5) |
                     0xff000000,true,"%s = %s",local_80,(ImVec2 *)buff);
        }
      }
      bVar8 = ImGui::IsItemActive();
      if (bVar8) {
        bVar8 = ImGui::IsMouseDragging(0,-1.0);
        if (!bVar8) {
          return false;
        }
        IVar15 = GetPlotMousePos(-1);
        dVar11 = IVar15.x;
        *value = dVar11;
        dVar4 = (pIVar7->CurrentPlot->XAxis).Range.Min;
        dVar14 = (pIVar7->CurrentPlot->XAxis).Range.Max;
        if (dVar11 <= dVar14) {
          dVar14 = dVar11;
        }
        uVar9 = -(ulong)(dVar11 < dVar4);
        *value = (double)(uVar9 & (ulong)dVar4 | ~uVar9 & (ulong)dVar14);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool DragLineX(const char* id, double* value, bool show_label, const ImVec4& col, float thickness) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(gp.CurrentPlot != NULL, "DragLineX() needs to be called between BeginPlot() and EndPlot()!");
    const float grab_size = ImMax(5.0f, thickness);
    float yt = gp.CurrentPlot->PlotRect.Min.y;
    float yb = gp.CurrentPlot->PlotRect.Max.y;
    float x  = IM_ROUND(PlotToPixels(*value,0).x);
    const bool outside = x < (gp.CurrentPlot->PlotRect.Min.x - grab_size / 2) || x > (gp.CurrentPlot->PlotRect.Max.x + grab_size / 2);
    if (outside)
        return false;
    float len = gp.Style.MajorTickLen.x;
    ImVec4 color = IsColorAuto(col) ? ImGui::GetStyleColorVec4(ImGuiCol_Text) : col;
    ImU32 col32 = ImGui::ColorConvertFloat4ToU32(color);
    ImDrawList& DrawList = *GetPlotDrawList();
    PushPlotClipRect();
    DrawList.AddLine(ImVec2(x,yt), ImVec2(x,yb),     col32, thickness);
    DrawList.AddLine(ImVec2(x,yt), ImVec2(x,yt+len), col32, 3*thickness);
    DrawList.AddLine(ImVec2(x,yb), ImVec2(x,yb-len), col32, 3*thickness);
    PopPlotClipRect();
    if (gp.CurrentPlot->Selecting || gp.CurrentPlot->Querying)
        return false;
    ImVec2 old_cursor_pos = ImGui::GetCursorScreenPos();
    ImVec2 new_cursor_pos = ImVec2(x - grab_size / 2.0f, yt);
    ImGui::GetCurrentWindow()->DC.CursorPos = new_cursor_pos;
    ImGui::InvisibleButton(id, ImVec2(grab_size, yb-yt));
    ImGui::GetCurrentWindow()->DC.CursorPos = old_cursor_pos;
    if (ImGui::IsItemHovered() || ImGui::IsItemActive()) {
        gp.CurrentPlot->PlotHovered = false;
        ImGui::SetMouseCursor(ImGuiMouseCursor_ResizeEW);
        if (show_label) {
            char buff[32];
            LabelAxisValue(gp.CurrentPlot->XAxis, gp.XTicks, *value, buff, 32);
            gp.Annotations.Append(ImVec2(x,yb),ImVec2(0,0),col32,CalcTextColor(color),true,"%s = %s", id, buff);
        }
    }
    bool dragging = false;
    if (ImGui::IsItemActive() && ImGui::IsMouseDragging(0)) {
        *value = ImPlot::GetPlotMousePos().x;
        *value = ImClamp(*value, gp.CurrentPlot->XAxis.Range.Min, gp.CurrentPlot->XAxis.Range.Max);
        dragging = true;
    }
    return dragging;
}